

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.c
# Opt level: O1

int unisound_app_start(hbm_command_cb cmd_callback)

{
  CommProtocolHooks hooks;
  
  CommProtocolRegisterHooks();
  CommProtocolInit(UartWrite,ChnlReceiveCommProtocolPacket);
  ChnlInit(cmd_callback);
  return 0;
}

Assistant:

int unisound_app_start(hbm_command_cb cmd_callback) {
  CommProtocolHooks hooks = {0};
  hooks.free_fn    = uni_free;
  hooks.malloc_fn  = uni_malloc;
  hooks.msleep_fn  = uni_msleep;
  hooks.realloc_fn = uni_realloc;

  hooks.sem_alloc_fn     = _comm_protocol_sem_alloc_fn;
  hooks.sem_destroy_fn   = _comm_protocol_sem_destroy_fn;
  hooks.sem_init_fn      = _comm_protocol_sem_init;
  hooks.sem_post_fn      = _comm_protocol_sem_post_fn;
  hooks.sem_wait_fn      = _comm_protocol_sem_wait_fn;
  hooks.sem_timedwait_fn = _comm_protocol_sem_timedwait_fn;

  CommProtocolRegisterHooks(&hooks);
  CommProtocolInit(UartWrite, ChnlReceiveCommProtocolPacket);
  ChnlInit(cmd_callback);

  return 0;
}